

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O0

int Nm_ManFindIdByNameTwoTypes(Nm_Man_t *p,char *pName,int Type1,int Type2)

{
  undefined4 local_2c;
  int iNodeId;
  int Type2_local;
  int Type1_local;
  char *pName_local;
  Nm_Man_t *p_local;
  
  local_2c = Nm_ManFindIdByName(p,pName,Type1);
  if (local_2c == -1) {
    local_2c = Nm_ManFindIdByName(p,pName,Type2);
  }
  if (local_2c == -1) {
    p_local._4_4_ = -1;
  }
  else {
    p_local._4_4_ = local_2c;
  }
  return p_local._4_4_;
}

Assistant:

int Nm_ManFindIdByNameTwoTypes( Nm_Man_t * p, char * pName, int Type1, int Type2 )
{
    int iNodeId;
    iNodeId = Nm_ManFindIdByName( p, pName, Type1 );
    if ( iNodeId == -1 )
        iNodeId = Nm_ManFindIdByName( p, pName, Type2 );
    if ( iNodeId == -1 )
        return -1;
    return iNodeId;
}